

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_body_slot(parser *p)

{
  long *plVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  long *plVar7;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar4 + 0x18);
    if (*(long **)((long)pvVar4 + 0x18) == (long *)0x0) {
      plVar7 = (long *)((long)pvVar4 + 0x18);
    }
    else {
      do {
        plVar7 = plVar1;
        plVar1 = (long *)*plVar7;
      } while ((long *)*plVar7 != (long *)0x0);
    }
    pvVar5 = mem_zalloc(0x20);
    *plVar7 = (long)pvVar5;
    pcVar6 = parser_getsym(p,"slot");
    iVar2 = lookup_flag(slots,pcVar6);
    if (iVar2 == 0) {
      pVar3 = PARSE_ERROR_INVALID_FLAG;
    }
    else {
      *(short *)((long)pvVar5 + 8) = (short)iVar2;
      pcVar6 = parser_getsym(p,"name");
      pcVar6 = string_make(pcVar6);
      *(char **)((long)pvVar5 + 0x10) = pcVar6;
      *(short *)((long)pvVar4 + 0x10) = *(short *)((long)pvVar4 + 0x10) + 1;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_body_slot(struct parser *p) {
	struct player_body *b = parser_priv(p);
	struct equip_slot *slot;
	int n;

	if (!b) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the last valid slot, then allocate a new one */
	slot = b->slots;
	if (!slot) {
		b->slots = mem_zalloc(sizeof(struct equip_slot));
		slot = b->slots;
	} else {
		while (slot->next) slot = slot->next;
		slot->next = mem_zalloc(sizeof(struct equip_slot));
		slot = slot->next;
	}

	n = lookup_flag(slots, parser_getsym(p, "slot"));
	if (!n) {
		return PARSE_ERROR_INVALID_FLAG;
	}
	slot->type = n;
	slot->name = string_make(parser_getsym(p, "name"));
	b->count++;
	return PARSE_ERROR_NONE;
}